

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O0

void __thiscall
apple_sysf_t::sysf_store_body_t::sysf_store_body_t
          (sysf_store_body_t *this,kstream *p__io,apple_sysf_t *p__parent,apple_sysf_t *p__root)

{
  apple_sysf_t *p__root_local;
  apple_sysf_t *p__parent_local;
  kstream *p__io_local;
  sysf_store_body_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__sysf_store_body_t_00228b78;
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>,std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,std::default_delete<apple_sysf_t::sysf_variable_t>>>>>>
              *)&this->m_variables);
  std::
  unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->m_zeroes);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  unique_ptr<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>,_std::allocator<std::unique_ptr<apple_sysf_t::sysf_variable_t,_std::default_delete<apple_sysf_t::sysf_variable_t>_>_>_>_>_>
  ::operator=(&this->m_variables,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&this->m_zeroes,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

apple_sysf_t::sysf_store_body_t::sysf_store_body_t(kaitai::kstream* p__io, apple_sysf_t* p__parent, apple_sysf_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_variables = nullptr;
    m_zeroes = nullptr;
    _read();
}